

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool slang::parsing::isSameToken(Token left,Token right)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pTVar4;
  string_view sVar5;
  string_view sVar6;
  Trivia *local_80;
  iterator rit;
  iterator lit;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> rt;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> lt;
  undefined1 local_30 [8];
  Token right_local;
  Token left_local;
  
  right_local._0_8_ = right.info;
  right_local.info._0_2_ = left.kind;
  local_30._0_2_ = right.kind;
  if ((TokenKind)right_local.info == local_30._0_2_) {
    local_30 = (undefined1  [8])right._0_8_;
    right_local.info = left._0_8_;
    sVar5 = Token::rawText((Token *)&right_local.info);
    sVar6 = Token::rawText((Token *)local_30);
    bVar1 = std::operator!=(sVar5,sVar6);
    if (!bVar1) {
      join_0x00000010_0x00000000_ = Token::trivia((Token *)&right_local.info);
      _lit = Token::trivia((Token *)local_30);
      sVar2 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&rt.size_);
      sVar3 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&lit);
      if (sVar2 != sVar3) {
        return false;
      }
      rit = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                      ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&rt.size_);
      local_80 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
                 begin((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&lit);
      while( true ) {
        pTVar4 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
                           ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&rt.size_)
        ;
        if (rit == pTVar4) {
          return true;
        }
        if (rit->kind != local_80->kind) break;
        sVar5 = Trivia::getRawText(rit);
        sVar6 = Trivia::getRawText(local_80);
        bVar1 = std::operator!=(sVar5,sVar6);
        if (bVar1) {
          return false;
        }
        rit = rit + 1;
        local_80 = local_80 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

static bool isSameToken(Token left, Token right) {
    if (left.kind != right.kind || left.rawText() != right.rawText())
        return false;

    auto lt = left.trivia();
    auto rt = right.trivia();
    if (lt.size() != rt.size())
        return false;

    for (auto lit = lt.begin(), rit = rt.begin(); lit != lt.end(); lit++, rit++) {
        if (lit->kind != rit->kind || lit->getRawText() != rit->getRawText())
            return false;
    }
    return true;
}